

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall pstore::storage::shrink(storage *this,uint64_t new_size)

{
  bool bVar1;
  anon_class_8_1_696c1832 __f;
  element_type *peVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  type paVar5;
  iterator pvVar6;
  iterator pvVar7;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> local_50;
  storage_type<pstore::gsl::details::extent_type<65536L>_> local_40;
  undefined1 local_38 [8];
  span<pstore::sat_entry,__1L> sp;
  memory_mapper_ptr *region;
  uint64_t new_size_local;
  storage *this_local;
  
  while( true ) {
    bVar1 = std::
            vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
            ::empty(&this->regions_);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      paVar5 = std::
               unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               ::operator*(&this->sat_);
      pvVar6 = std::begin<std::array<pstore::sat_entry,65536ul>>(paVar5);
      paVar5 = std::
               unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               ::operator*(&this->sat_);
      pvVar7 = std::end<std::array<pstore::sat_entry,65536ul>>(paVar5);
      bVar1 = std::all_of<pstore::sat_entry*,pstore::storage::shrink(unsigned_long)::__3>
                        (pvVar6,pvVar7);
      if (bVar1) {
        return;
      }
      assert_failed("std::all_of (std::begin (*sat_), std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x77);
    }
    __f.region = std::
                 vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                 ::back(&this->regions_);
    peVar2 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)__f.region);
    uVar3 = memory_mapper_base::offset(peVar2);
    if ((uVar3 & 0x3fffff) != 0) break;
    peVar2 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)__f.region);
    uVar3 = memory_mapper_base::size(peVar2);
    if ((uVar3 & 0x3fffff) != 0) break;
    peVar2 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)__f.region);
    uVar3 = memory_mapper_base::offset(peVar2);
    if (uVar3 < new_size) {
      paVar5 = std::
               unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               ::operator*(&this->sat_);
      pvVar6 = std::begin<std::array<pstore::sat_entry,65536ul>>(paVar5);
      peVar2 = std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)__f.region);
      uVar3 = memory_mapper_base::end(peVar2);
      paVar5 = std::
               unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               ::operator*(&this->sat_);
      pvVar7 = std::end<std::array<pstore::sat_entry,65536ul>>(paVar5);
      bVar1 = std::all_of<pstore::sat_entry*,pstore::storage::shrink(unsigned_long)::__0>
                        (pvVar6 + (uVar3 >> 0x16),pvVar7);
      if (bVar1) {
        return;
      }
      assert_failed("std::all_of (std::begin (*sat_) + region->end () / address::segment_size, std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x5f);
    }
    paVar5 = std::
             unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
             ::operator*(&this->sat_);
    local_40.data_ = (pointer)gsl::make_span<pstore::sat_entry,65536ul>(paVar5);
    peVar2 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)__f.region);
    uVar3 = memory_mapper_base::offset(peVar2);
    peVar2 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)__f.region);
    uVar4 = memory_mapper_base::size(peVar2);
    _local_38 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                gsl::span<pstore::sat_entry,_65536L>::subspan
                          ((span<pstore::sat_entry,_65536L> *)&local_40,uVar3 >> 0x16,uVar4 >> 0x16)
    ;
    std::begin<pstore::gsl::span<pstore::sat_entry,_1l>>((span<pstore::sat_entry,__1L> *)&local_50);
    std::end<pstore::gsl::span<pstore::sat_entry,_1l>>((span<pstore::sat_entry,__1L> *)&local_60);
    std::
    for_each<pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_1l>,false>,pstore::storage::shrink(unsigned_long)::__1>
              (&local_50,&local_60,__f);
    paVar5 = std::
             unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
             ::operator*(&this->sat_);
    pvVar6 = std::begin<std::array<pstore::sat_entry,65536ul>>(paVar5);
    paVar5 = std::
             unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
             ::operator*(&this->sat_);
    pvVar7 = std::end<std::array<pstore::sat_entry,65536ul>>(paVar5);
    bVar1 = std::all_of<pstore::sat_entry*,pstore::storage::shrink(unsigned_long)::__2>
                      (pvVar6,pvVar7,__f);
    if (!bVar1) {
      assert_failed("std::all_of ( std::begin (*sat_), std::end (*sat_), [&region] (sat_entry const & segment) { return segment.region != region; })"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x6e);
    }
    std::
    vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
    ::pop_back(&this->regions_);
  }
  assert_failed("region->offset () % address::segment_size == 0 && region->size () % address::segment_size == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,0x58);
}

Assistant:

void storage::shrink (std::uint64_t const new_size) {
        // We now look backwards through the regions, discarding segments and regions introduced
        // by this transaction
        while (!regions_.empty ()) {
            region::memory_mapper_ptr const & region = regions_.back ();
            PSTORE_ASSERT (region->offset () % address::segment_size == 0 &&
                           region->size () % address::segment_size == 0);
            if (region->offset () < new_size) {
                // Guarantee that segments beyond the mapped memory blocks are null.
                PSTORE_ASSERT (
                    std::all_of (std::begin (*sat_) + region->end () / address::segment_size,
                                 std::end (*sat_), [] (sat_entry const & s) {
                                     return s.value == nullptr && s.region == nullptr;
                                 }));
                return;
            }

            // Remove the entries in the segment address table.
            auto const sp = gsl::make_span (*sat_).subspan (
                region->offset () / address::segment_size, region->size () / address::segment_size);
            std::for_each (std::begin (sp), std::end (sp), [&region] (sat_entry & segment) {
                PSTORE_ASSERT (segment.region == region);
                segment.region = nullptr;
                segment.value = nullptr;
            });
            // Check that we caught every reference to this region.
            PSTORE_ASSERT (std::all_of (
                std::begin (*sat_), std::end (*sat_),
                [&region] (sat_entry const & segment) { return segment.region != region; }));

            // Remove the region itself.
            regions_.pop_back ();
        }

        // There are no mapped memory blocks. The segment address table should be all null.
        PSTORE_ASSERT (std::all_of (std::begin (*sat_), std::end (*sat_), [] (sat_entry const & s) {
            return s.value == nullptr && s.region == nullptr;
        }));
    }